

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O3

void __thiscall cmInstalledFile::SetName(cmInstalledFile *this,cmMakefile *mf,string *name)

{
  pointer pcVar1;
  undefined1 __p [8];
  cmake *cmakeInstance;
  cmListFileBacktrace backtrace;
  cmGeneratorExpression ge;
  cmListFileBacktrace local_78;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  undefined1 local_58 [8];
  element_type *local_50;
  undefined1 local_40 [40];
  
  cmMakefile::GetBacktrace(mf);
  cmakeInstance = cmMakefile::GetCMakeInstance(mf);
  local_78.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_68;
  local_78.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = local_60;
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_60->_M_use_count = local_60->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_60->_M_use_count = local_60->_M_use_count + 1;
    }
  }
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)(local_40 + 0x10),cmakeInstance,&local_78);
  if (local_78.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  std::__cxx11::string::_M_assign((string *)this);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_50 = (element_type *)local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_58,(string *)(local_40 + 0x10));
  __p = local_58;
  local_58 = (undefined1  [8])0x0;
  std::
  __uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  ::reset((__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           *)&this->NameExpression,(pointer)__p);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)local_58);
  if (local_50 != (element_type *)local_40) {
    operator_delete(local_50,local_40._0_8_ + 1);
  }
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)(local_40 + 0x10));
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  return;
}

Assistant:

void cmInstalledFile::SetName(cmMakefile* mf, const std::string& name)
{
  cmListFileBacktrace backtrace = mf->GetBacktrace();
  cmGeneratorExpression ge(*mf->GetCMakeInstance(), backtrace);

  this->Name = name;
  this->NameExpression = ge.Parse(name);
}